

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O0

int __thiscall GrcManager::CalculateSilfVersion(GrcManager *this,int fxdSilfSpecVersion)

{
  bool bVar1;
  size_type_conflict sVar2;
  reference ppGVar3;
  int in_ESI;
  GrcManager *in_RDI;
  int n;
  vector<int,_std::allocator<int>_> vnIndices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs_1;
  GdlGlyphClassDefn *pglfc_1;
  int ipglfc_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  GdlGlyphClassDefn *pglfc;
  int ipglfc;
  size_t cbSpaceNeeded;
  int fxdResult;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffe68;
  GdlGlyphClassDefn *in_stack_fffffffffffffe70;
  GdlRenderer *in_stack_fffffffffffffe78;
  allocator *paVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  string *in_stack_fffffffffffffea8;
  GdlObject *in_stack_fffffffffffffeb8;
  string local_140 [4];
  int in_stack_fffffffffffffec4;
  GrcErrorList *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [36];
  undefined4 local_8c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_70;
  value_type local_58;
  int local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_40;
  value_type local_28;
  int local_1c;
  ulong local_18;
  int local_10;
  int local_c;
  
  local_10 = in_ESI;
  if ((in_RDI->m_tcCompressor != ktcNone) && (in_ESI < 0x50000)) {
    local_10 = 0x50000;
  }
  local_c = in_ESI;
  bVar1 = GdlRenderer::HasCollisionPass(in_stack_fffffffffffffe78);
  if ((bVar1) && (local_10 < 0x40001)) {
    local_10 = 0x40001;
  }
  bVar1 = IncludePassOptimizations(in_RDI);
  if ((bVar1) && (local_10 < 0x40000)) {
    local_10 = 0x40000;
  }
  if (local_10 < 0x40000) {
    local_18 = 4;
    sVar2 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                      (&in_RDI->m_vpglfcReplcmtClasses);
    local_18 = (sVar2 + 1) * 2 + local_18;
    for (local_1c = 0; local_1c < in_RDI->m_cpglfcLinear; local_1c = local_1c + 1) {
      ppGVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                          (&in_RDI->m_vpglfcReplcmtClasses,(long)local_1c);
      local_28 = *ppGVar3;
      in_stack_fffffffffffffea8 = (string *)&local_40;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x24f0b7);
      GdlGlyphClassDefn::GenerateOutputGlyphList
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_40);
      local_18 = sVar2 * 2 + local_18;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffffe80);
    }
    local_50 = in_RDI->m_cpglfcLinear;
    while (in_stack_fffffffffffffea4 = local_50,
          sVar2 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::size
                            (&in_RDI->m_vpglfcReplcmtClasses),
          in_stack_fffffffffffffea4 < (int)sVar2) {
      ppGVar3 = std::vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>::operator[]
                          (&in_RDI->m_vpglfcReplcmtClasses,(long)local_50);
      local_58 = *ppGVar3;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x24f1a7);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x24f1b9);
      GdlGlyphClassDefn::GenerateInputGlyphList
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                 (vector<int,_std::allocator<int>_> *)0x24f1d0);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_70);
      local_8c = (undefined4)sVar2;
      local_18 = local_18 + 8;
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_70);
      local_18 = sVar2 * 4 + local_18;
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe80);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffffe80);
      local_50 = local_50 + 1;
    }
    if (0xffff < local_18) {
      local_10 = 0x40000;
    }
  }
  if ((local_c < local_10) && (bVar1 = UserSpecifiedVersion(in_RDI), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Version ",&local_b1);
    VersionString_abi_cxx11_(in_stack_fffffffffffffeec);
    paVar4 = &local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8," of the Silf table is inadequate for your specification; version ",paVar4);
    VersionString_abi_cxx11_(in_stack_fffffffffffffeec);
    paVar4 = (allocator *)&stack0xfffffffffffffebf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140," will be generated instead.",paVar4);
    GrcErrorList::AddWarning
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
               (string *)in_RDI,in_stack_fffffffffffffea8,
               (string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffee0,
               (string *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  SetTableVersion(in_RDI,0x15,local_10);
  return local_10;
}

Assistant:

int GrcManager::CalculateSilfVersion(int fxdSilfSpecVersion)
{
	int fxdResult = fxdSilfSpecVersion;

	if (m_tcCompressor != ktcNone && fxdResult < 0x00050000)
	{
	    fxdResult = 0x00050000;
	}
	if (m_prndr->HasCollisionPass() && fxdResult < 0x00040001)
	{
		fxdResult = 0x00040001;
	}
	if (this->IncludePassOptimizations() && fxdResult < 0x00040000)
	{
		// Although earlier versions of the Silf table have space for the skip-passes attribute,
		// OTS will complain if the value is anything other than zero. So bump up the version
		// to match.
		fxdResult = 0x00040000;
	}
	if (fxdResult < 0x00040000)
	{
		//	Calculate it based on what is needed to handle the size of the class map
		//	(replacement class data).
		size_t cbSpaceNeeded;	// # of bytes needed = max offset

		//	number of classes
		cbSpaceNeeded = 4;

		//	the offsets to classes themselves, assuming short ints
		cbSpaceNeeded += (m_vpglfcReplcmtClasses.size() + 1) * 2;

		//	Space needed for the class glyph lists

		for (int ipglfc = 0; ipglfc < m_cpglfcLinear; ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
			//Assert(pglfc->ReplcmtOutputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			pglfc->GenerateOutputGlyphList(vwGlyphs);

			cbSpaceNeeded += vwGlyphs.size() * 2;
		}

		//	indexed classes (input)
		for (int ipglfc = m_cpglfcLinear; ipglfc < signed(m_vpglfcReplcmtClasses.size()); ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtInputClass());
			//Assert(pglfc->ReplcmtInputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			std::vector<int> vnIndices;
			pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
			int n = signed(vwGlyphs.size());
			cbSpaceNeeded += 8;	// search constants
			cbSpaceNeeded += vwGlyphs.size() * 4;
		}

		if (cbSpaceNeeded > 0xFFFF)
		{
			// Offsets won't all fit in short ints; we need long ints.
			fxdResult = 0x00040000;
		}
	}

	if (fxdResult > fxdSilfSpecVersion)
	{
		if (UserSpecifiedVersion())
			g_errorList.AddWarning(5504, NULL,
				"Version ",
				VersionString(fxdSilfSpecVersion),
				" of the Silf table is inadequate for your specification; version ",
				VersionString(fxdResult),
				" will be generated instead.");

//		else
//			g_errorList.AddWarning(5505, NULL,
//				"Version ",
//				VersionString(fxdResult),
//				" of the Silf table will be generated.");
	}

	SetTableVersion(ktiSilf, fxdResult);

	return fxdResult;
}